

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int whereUsablePartialIndex(int iTab,WhereClause *pWC,Expr *pWhere)

{
  u8 uVar1;
  Expr *pE1;
  int iVar2;
  int iVar3;
  WhereTerm *pWVar4;
  Parse *pParse;
  
  pParse = pWC->pWInfo->pParse;
  uVar1 = pWhere->op;
  while (uVar1 == 'G') {
    iVar2 = whereUsablePartialIndex(iTab,pWC,pWhere->pLeft);
    if (iVar2 == 0) {
      return 0;
    }
    pWhere = pWhere->pRight;
    uVar1 = pWhere->op;
  }
  if ((pParse->db->flags & 0x400000) != 0) {
    pParse = (Parse *)0x0;
  }
  if (0 < pWC->nTerm) {
    pWVar4 = pWC->a;
    iVar2 = 0;
    do {
      pE1 = pWVar4->pExpr;
      if ((((pE1->flags & 1) == 0) || (pE1->iRightJoinTable == iTab)) &&
         (iVar3 = sqlite3ExprImpliesExpr(pParse,pE1,pWhere,iTab), iVar3 != 0)) {
        return 1;
      }
      iVar2 = iVar2 + 1;
      pWVar4 = pWVar4 + 1;
    } while (iVar2 < pWC->nTerm);
  }
  return 0;
}

Assistant:

static int whereUsablePartialIndex(int iTab, WhereClause *pWC, Expr *pWhere){
  int i;
  WhereTerm *pTerm;
  Parse *pParse = pWC->pWInfo->pParse;
  while( pWhere->op==TK_AND ){
    if( !whereUsablePartialIndex(iTab,pWC,pWhere->pLeft) ) return 0;
    pWhere = pWhere->pRight;
  }
  if( pParse->db->flags & SQLITE_EnableQPSG ) pParse = 0;
  for(i=0, pTerm=pWC->a; i<pWC->nTerm; i++, pTerm++){
    Expr *pExpr = pTerm->pExpr;
    if( (!ExprHasProperty(pExpr, EP_FromJoin) || pExpr->iRightJoinTable==iTab)
     && sqlite3ExprImpliesExpr(pParse, pExpr, pWhere, iTab) 
    ){
      return 1;
    }
  }
  return 0;
}